

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O1

double __thiscall
double_conversion::StringToDoubleConverter::StringToIeee<char_const*>
          (StringToDoubleConverter *this,char *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  byte *pbVar1;
  byte *pbVar2;
  uc16 uVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  locale *plVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  byte bVar17;
  byte *pbVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  byte *pbVar23;
  long in_FS_OFFSET;
  bool sign;
  float fVar24;
  Vector<const_char> trimmed;
  Vector<const_char> trimmed_00;
  bool *in_stack_fffffffffffffc40;
  undefined8 local_3a8;
  int local_36c;
  char *start;
  bool result_is_junk_1;
  char *end;
  undefined8 local_350;
  char buffer [782];
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  lVar22 = (long)length;
  pbVar23 = (byte *)(input + lVar22);
  *processed_characters_count = 0;
  end = (char *)pbVar23;
  local_350 = (byte *)input;
  if (length == 0) {
LAB_003ecc40:
    local_3a8._0_4_ = SUB84(this->empty_string_value_,0);
    local_3a8._4_4_ = (uint)((ulong)this->empty_string_value_ >> 0x20);
    goto LAB_003ed4e6;
  }
  uVar4 = this->flags_;
  iVar11 = (int)input;
  if ((uVar4 & 0x18) != 0) {
    in_stack_fffffffffffffc40 = (bool *)0x3ecb09;
    bVar7 = isWhitespace((int)*input);
    pbVar18 = (byte *)input;
    if (bVar7) {
      do {
        lVar22 = lVar22 + -1;
        pbVar1 = pbVar23;
        if (lVar22 == 0) goto LAB_003ecc35;
        pbVar18 = pbVar18 + 1;
        in_stack_fffffffffffffc40 = (bool *)0x3ecb34;
        bVar7 = isWhitespace((int)(char)*pbVar18);
      } while (bVar7);
      local_350 = pbVar18;
      pbVar1 = pbVar18;
      if (lVar22 == 0) {
LAB_003ecc35:
        local_350 = pbVar1;
        *processed_characters_count = (int)local_350 - iVar11;
        goto LAB_003ecc40;
      }
    }
    if (((uVar4 & 8) != 0) || (local_350 == (byte *)input)) goto LAB_003ecb63;
    goto LAB_003ed4df;
  }
LAB_003ecb63:
  pbVar18 = local_350;
  bVar9 = *local_350;
  if ((bVar9 == 0x2d) || (bVar9 == 0x2b)) {
    sign = bVar9 == 0x2d;
    pbVar1 = local_350 + 1;
    bVar7 = pbVar1 != pbVar23;
    lVar22 = 1;
    if (bVar7) {
      pbVar2 = local_350 + 1;
      in_stack_fffffffffffffc40 = (bool *)0x3ecbaa;
      local_350 = pbVar1;
      bVar8 = isWhitespace((int)(char)*pbVar2);
      pbVar1 = local_350;
      if (bVar8) {
        lVar19 = 2;
        do {
          bVar7 = pbVar18 + lVar19 != pbVar23;
          lVar22 = (long)pbVar23 - (long)pbVar18;
          pbVar1 = local_350;
          if (pbVar18 + lVar19 == pbVar23) break;
          in_stack_fffffffffffffc40 = (bool *)0x3ecbdb;
          bVar8 = isWhitespace((int)(char)pbVar18[lVar19]);
          lVar22 = lVar19;
          lVar19 = lVar19 + 1;
          pbVar1 = local_350;
        } while (bVar8);
      }
    }
    local_350 = pbVar1;
    if ((bVar7) && (((uVar4 & 0x20) != 0 || (lVar22 == 1)))) {
      local_350 = pbVar18 + lVar22;
      bVar7 = true;
    }
    else {
      local_3a8 = this->junk_string_value_;
      bVar7 = false;
    }
    if (!bVar7) goto LAB_003ed4eb;
  }
  else {
    sign = false;
  }
  pbVar23 = (byte *)this->infinity_symbol_;
  if (pbVar23 != (byte *)0x0) {
    bVar9 = *local_350;
    if ((uVar4 & 0x40) == 0) {
      bVar7 = *pbVar23 == bVar9;
    }
    else {
      if (((anonymous_namespace)::ToLower(char)::cType == '\0') &&
         (iVar15 = __cxa_guard_acquire(&(anonymous_namespace)::ToLower(char)::cType), iVar15 != 0))
      {
        plVar13 = (locale *)std::locale::classic();
        (anonymous_namespace)::ToLower(char)::cType = std::use_facet<std::ctype<char>>(plVar13);
        __cxa_guard_release(&(anonymous_namespace)::ToLower(char)::cType);
      }
      in_stack_fffffffffffffc40 = (bool *)0x3ecca3;
      bVar9 = (**(code **)(*(long *)(anonymous_namespace)::ToLower(char)::cType + 0x20))
                        ((anonymous_namespace)::ToLower(char)::cType,(int)(char)bVar9);
      bVar7 = bVar9 == *pbVar23;
    }
    pcVar6 = end;
    if (!bVar7) goto LAB_003ecd53;
    bVar7 = (anonymous_namespace)::ConsumeSubString<char_const*>
                      ((char **)&local_350,end,this->infinity_symbol_,SUB41((uVar4 & 0x40) >> 6,0));
    pbVar23 = local_350;
    if ((bVar7) && (((uVar4 & 0x14) != 0 || (local_350 == (byte *)pcVar6)))) {
      if ((uVar4 & 4) == 0) {
        bVar7 = local_350 != (byte *)pcVar6;
        pbVar18 = pbVar23;
        if ((bVar7) && (bVar8 = isWhitespace((int)(char)*local_350), bVar8)) {
          do {
            pbVar23 = pbVar23 + 1;
            bVar7 = pbVar23 != (byte *)pcVar6;
            pbVar18 = (byte *)pcVar6;
            if (pbVar23 == (byte *)pcVar6) break;
            bVar8 = isWhitespace((int)(char)*pbVar23);
            pbVar18 = pbVar23;
          } while (bVar8);
        }
        local_350 = pbVar18;
        if (bVar7) goto LAB_003ed4df;
      }
      *processed_characters_count = (int)local_350 - iVar11;
      if (sign == false) {
        local_3a8._0_4_ = 0;
        local_3a8._4_4_ = 0x7ff00000;
      }
      else {
        local_3a8._0_4_ = 0;
        local_3a8._4_4_ = 0xfff00000;
      }
      goto LAB_003ed4e6;
    }
    goto LAB_003ed4df;
  }
LAB_003ecd53:
  pbVar23 = (byte *)this->nan_symbol_;
  if (pbVar23 != (byte *)0x0) {
    bVar9 = *local_350;
    if ((uVar4 & 0x40) == 0) {
      bVar7 = *pbVar23 == bVar9;
    }
    else {
      if (((anonymous_namespace)::ToLower(char)::cType == '\0') &&
         (iVar15 = __cxa_guard_acquire(&(anonymous_namespace)::ToLower(char)::cType), iVar15 != 0))
      {
        plVar13 = (locale *)std::locale::classic();
        (anonymous_namespace)::ToLower(char)::cType = std::use_facet<std::ctype<char>>(plVar13);
        __cxa_guard_release(&(anonymous_namespace)::ToLower(char)::cType);
      }
      in_stack_fffffffffffffc40 = (bool *)0x3ecd93;
      bVar9 = (**(code **)(*(long *)(anonymous_namespace)::ToLower(char)::cType + 0x20))
                        ((anonymous_namespace)::ToLower(char)::cType,(int)(char)bVar9);
      bVar7 = bVar9 == *pbVar23;
    }
    pcVar6 = end;
    if (bVar7) {
      bVar7 = (anonymous_namespace)::ConsumeSubString<char_const*>
                        ((char **)&local_350,end,this->nan_symbol_,SUB41((uVar4 & 0x40) >> 6,0));
      pbVar23 = local_350;
      if ((bVar7) && (((uVar4 & 0x14) != 0 || (local_350 == (byte *)pcVar6)))) {
        if ((uVar4 & 4) == 0) {
          bVar7 = local_350 != (byte *)pcVar6;
          pbVar18 = pbVar23;
          if ((bVar7) && (bVar8 = isWhitespace((int)(char)*local_350), bVar8)) {
            do {
              pbVar23 = pbVar23 + 1;
              bVar7 = pbVar23 != (byte *)pcVar6;
              pbVar18 = (byte *)pcVar6;
              if (pbVar23 == (byte *)pcVar6) break;
              bVar8 = isWhitespace((int)(char)*pbVar23);
              pbVar18 = pbVar23;
            } while (bVar8);
          }
          local_350 = pbVar18;
          if (bVar7) goto LAB_003ed4df;
        }
        *processed_characters_count = (int)local_350 - iVar11;
        if (sign == false) {
          local_3a8._0_4_ = 0;
          local_3a8._4_4_ = 0x7ff80000;
        }
        else {
          local_3a8._0_4_ = 0;
          local_3a8._4_4_ = 0xfff80000;
        }
      }
      else {
LAB_003ed4df:
        local_3a8._0_4_ = SUB84(this->junk_string_value_,0);
        local_3a8._4_4_ = (uint)((ulong)this->junk_string_value_ >> 0x20);
      }
      goto LAB_003ed4e6;
    }
  }
  bVar9 = *local_350;
  bVar17 = 0;
  if (bVar9 != 0x30) {
LAB_003ece60:
    iVar20 = 0;
    uVar3 = this->separator_;
    bVar7 = false;
    local_36c = 0;
    iVar21 = 0;
    iVar15 = 0;
    do {
      bVar14 = *local_350;
      if (9 < (byte)(bVar14 - 0x30)) {
        if (iVar21 == 0) {
          bVar17 = 0;
        }
        iVar15 = 0;
        if (bVar14 != 0x2e) goto LAB_003ed0e0;
        if (((~bVar17 | (byte)uVar4 >> 2) & 1) == 0) goto LAB_003ed618;
        if ((bVar17 & 1) == 0) {
          uVar3 = this->separator_;
          in_stack_fffffffffffffc40 = (bool *)0x3ed20b;
          bVar8 = Advance<char_const*>((char **)&local_350,uVar3,10,&end);
          if (!bVar8) {
            iVar15 = 0;
            if ((iVar21 != 0) || (*local_350 != 0x30)) goto LAB_003ed406;
            iVar15 = 0;
            goto LAB_003ed3df;
          }
          iVar15 = 0;
          pbVar23 = local_350;
          if ((iVar21 == 0) && (bVar9 != 0x30)) goto LAB_003ed618;
        }
        else {
          iVar15 = 0;
          pbVar23 = local_350;
        }
        break;
      }
      if (iVar21 < 0x304) {
        lVar22 = (long)iVar20;
        iVar20 = iVar20 + 1;
        buffer[lVar22] = bVar14;
        iVar21 = iVar21 + 1;
      }
      else {
        local_36c = local_36c + 1;
        bVar7 = (bool)(bVar14 != 0x30 | bVar7);
      }
      bVar14 = bVar17 & 1;
      bVar17 = false;
      if (bVar14 != 0) {
        bVar17 = (char)*local_350 < '8';
      }
      in_stack_fffffffffffffc40 = (bool *)0x3ecefa;
      bVar8 = Advance<char_const*>((char **)&local_350,uVar3,10,&end);
      pbVar23 = local_350;
    } while (!bVar8);
    goto LAB_003ecf01;
  }
  uVar3 = this->separator_;
  in_stack_fffffffffffffc40 = (bool *)0x3ecf95;
  bVar7 = Advance<char_const*>((char **)&local_350,uVar3,10,&end);
  pcVar6 = end;
  if (!bVar7) {
    bVar17 = (byte)this->flags_;
    if (((this->flags_ & 0x81U) != 0) && ((*local_350 | 0x20) == 0x78)) {
      pbVar23 = local_350 + 1;
      local_350 = pbVar23;
      if (pbVar23 != (byte *)end) {
        if ((char)bVar17 < '\0') {
          bVar7 = IsHexFloatString<char_const*>((char *)pbVar23,end,uVar3,SUB41((uVar4 & 4) >> 2,0))
          ;
        }
        else {
          bVar7 = false;
        }
        if (((bVar7 != false) ||
            (bVar9 = *pbVar23, (char)bVar9 < 0x40 && (int)(char)bVar9 - 0x30U < 10)) ||
           ((bVar9 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar9 - 0x41) & 0x3f) & 1) != 0))))
        {
          buffer[0] = -0x56;
          local_3a8 = RadixStringToIeee<4,char_const*>
                                ((char **)&local_350,pcVar6,sign,uVar3,bVar7,
                                 SUB41((uVar4 & 4) >> 2,0),this->junk_string_value_,read_as_double,
                                 (bool *)buffer);
          pbVar23 = local_350;
          if (buffer[0] != '\0') goto LAB_003ed4eb;
          pbVar18 = pbVar23;
          if ((local_350 != (byte *)pcVar6 && (uVar4 & 0x10) != 0) &&
             (bVar7 = isWhitespace((int)(char)*local_350), bVar7)) {
            do {
              pbVar23 = pbVar23 + 1;
              pbVar18 = (byte *)pcVar6;
              if (pbVar23 == (byte *)pcVar6) break;
              bVar7 = isWhitespace((int)(char)*pbVar23);
              pbVar18 = pbVar23;
            } while (bVar7);
          }
          local_350 = pbVar18;
          iVar11 = (int)local_350 - iVar11;
          goto LAB_003ecf69;
        }
      }
      local_3a8._0_4_ = SUB84(this->junk_string_value_,0);
      local_3a8._4_4_ = (uint)((ulong)this->junk_string_value_ >> 0x20);
      goto LAB_003ed4e6;
    }
    do {
      if (*local_350 != 0x30) {
        bVar17 = bVar17 >> 1;
        goto LAB_003ece60;
      }
      in_stack_fffffffffffffc40 = (bool *)0x3ed05a;
      bVar7 = Advance<char_const*>((char **)&local_350,uVar3,10,&end);
    } while (!bVar7);
  }
  iVar11 = (int)local_350 - iVar11;
LAB_003ecfa0:
  *processed_characters_count = iVar11;
  if (sign == false) {
    local_3a8._0_4_ = 0;
    local_3a8._4_4_ = 0;
  }
  else {
    local_3a8._0_4_ = 0;
    local_3a8._4_4_ = 0x80000000;
  }
  goto LAB_003ed4e6;
  while (iVar15 = iVar15 + -1, *local_350 == 0x30) {
LAB_003ed3df:
    in_stack_fffffffffffffc40 = (bool *)0x3ed3f1;
    bVar8 = Advance<char_const*>((char **)&local_350,uVar3,10,&end);
    if (bVar8) {
      iVar11 = (int)local_350 - iVar11;
      goto LAB_003ecfa0;
    }
  }
LAB_003ed406:
  do {
    bVar14 = *local_350;
    if (9 < (byte)(bVar14 - 0x30)) goto LAB_003ed0e0;
    if (iVar21 < 0x304) {
      lVar22 = (long)iVar20;
      iVar20 = iVar20 + 1;
      buffer[lVar22] = bVar14;
      iVar21 = iVar21 + 1;
      iVar15 = iVar15 + -1;
    }
    else {
      bVar7 = (bool)(bVar14 != 0x30 | bVar7);
    }
    in_stack_fffffffffffffc40 = (bool *)0x3ed45e;
    bVar8 = Advance<char_const*>((char **)&local_350,uVar3,10,&end);
    pbVar23 = local_350;
  } while (!bVar8);
  goto LAB_003ecf01;
LAB_003ed0e0:
  pbVar23 = local_350;
  pcVar6 = end;
  if ((iVar21 == 0 && iVar15 == 0) && bVar9 != 0x30) {
LAB_003ed4c2:
    local_3a8._0_4_ = SUB84(this->junk_string_value_,0);
    local_3a8._4_4_ = (uint)((ulong)this->junk_string_value_ >> 0x20);
  }
  else {
    if ((*local_350 | 0x20) == 0x65) {
      if (((~bVar17 | (byte)uVar4 >> 2) & 1) == 0) goto LAB_003ed4c2;
      if ((bVar17 & 1) == 0) {
        pbVar18 = local_350 + 1;
        if ((pbVar18 == (byte *)end) ||
           ((((bVar9 = *pbVar18, bVar9 == 0x2d || (bVar14 = 0x2b, bVar9 == 0x2b)) &&
             (pbVar18 = local_350 + 2, bVar14 = bVar9, pbVar18 == (byte *)end)) ||
            ((local_350 = pbVar18, pbVar18 = local_350, local_350 == (byte *)end ||
             ((byte)(*local_350 - 0x3a) < 0xf6)))))) {
          local_350 = pbVar18;
          if ((uVar4 & 4) == 0) {
            local_3a8 = this->junk_string_value_;
            iVar21 = 1;
          }
          else {
            iVar21 = 6;
            local_350 = pbVar23;
          }
        }
        else {
          iVar21 = 0;
          do {
            pbVar23 = local_350 + 1;
            if ((iVar21 < 0x6666666) ||
               ((iVar12 = 0x3fffffff, iVar21 == 0x6666666 && ((char)*local_350 < '4')))) {
              iVar12 = (int)(char)*local_350 + iVar21 * 10 + -0x30;
            }
            iVar21 = iVar12;
            local_350 = (byte *)end;
          } while ((pbVar23 != (byte *)end) && (local_350 = pbVar23, (byte)(*pbVar23 - 0x30) < 10));
          iVar12 = -iVar21;
          if (bVar14 != 0x2d) {
            iVar12 = iVar21;
          }
          iVar15 = iVar15 + iVar12;
          iVar21 = 0;
        }
        pbVar23 = local_350;
        if (iVar21 != 6) {
          if (iVar21 != 0) goto LAB_003ed4eb;
          goto LAB_003ed346;
        }
      }
    }
    else {
LAB_003ed346:
      pbVar23 = local_350;
      if (((uVar4 & 0x14) == 0) && (local_350 != (byte *)end)) goto LAB_003ed4c2;
      if ((uVar4 & 4) == 0) {
        bVar8 = local_350 != (byte *)end;
        pbVar18 = pbVar23;
        if (bVar8) {
          in_stack_fffffffffffffc40 = (bool *)0x3ed38e;
          bVar10 = isWhitespace((int)(char)*local_350);
          if (bVar10) {
            do {
              pbVar23 = pbVar23 + 1;
              bVar8 = pbVar23 != (byte *)pcVar6;
              pbVar18 = (byte *)pcVar6;
              if (pbVar23 == (byte *)pcVar6) break;
              in_stack_fffffffffffffc40 = (bool *)0x3ed3ae;
              bVar10 = isWhitespace((int)(char)*pbVar23);
              pbVar18 = pbVar23;
            } while (bVar10);
          }
        }
        local_350 = pbVar18;
        if (bVar8) {
LAB_003ed618:
          local_3a8._0_4_ = SUB84(this->junk_string_value_,0);
          local_3a8._4_4_ = (uint)((ulong)this->junk_string_value_ >> 0x20);
          goto LAB_003ed4e6;
        }
      }
      pbVar18 = local_350;
      pcVar6 = end;
      pbVar23 = pbVar18;
      if (((uVar4 & 0x10) != 0) && (local_350 != (byte *)end)) {
        in_stack_fffffffffffffc40 = (bool *)0x3ed656;
        bVar8 = isWhitespace((int)(char)*local_350);
        if (bVar8) {
          do {
            pbVar18 = pbVar18 + 1;
            pbVar23 = (byte *)pcVar6;
            if (pbVar18 == (byte *)pcVar6) break;
            in_stack_fffffffffffffc40 = (bool *)0x3ed674;
            bVar8 = isWhitespace((int)(char)*pbVar18);
            pbVar23 = pbVar18;
          } while (bVar8);
        }
      }
    }
LAB_003ecf01:
    local_350 = pbVar23;
    if ((bVar17 & 1) != 0) {
      result_is_junk_1 = true;
      start = buffer;
      local_3a8 = RadixStringToIeee<3,char*>
                            (&start,buffer + iVar20,sign,this->separator_,SUB41((uVar4 & 4) >> 2,0),
                             read_as_double,this->junk_string_value_,SUB81(&result_is_junk_1,0),
                             in_stack_fffffffffffffc40);
      iVar11 = (int)local_350 - iVar11;
LAB_003ecf69:
      *processed_characters_count = iVar11;
      goto LAB_003ed4eb;
    }
    iVar15 = iVar15 + local_36c;
    if (bVar7) {
      lVar22 = (long)iVar20;
      iVar20 = iVar20 + 1;
      buffer[lVar22] = '1';
      iVar15 = iVar15 + -1;
    }
    lVar22 = (long)iVar20;
    buffer[lVar22] = '\0';
    uVar16 = (ulong)(iVar20 + 1);
    do {
      if (lVar22 < 1) {
        uVar16 = 0;
        break;
      }
      uVar16 = (ulong)((int)uVar16 - 1);
      lVar19 = lVar22 + -1;
      lVar22 = lVar22 + -1;
    } while (buffer[lVar19] == '0');
    iVar15 = (iVar20 - (int)uVar16) + iVar15;
    if (read_as_double) {
      trimmed._8_8_ = uVar16;
      trimmed.start_ = buffer;
      local_3a8 = StrtodTrimmed(trimmed,iVar15);
    }
    else {
      trimmed_00._8_8_ = uVar16;
      trimmed_00.start_ = buffer;
      fVar24 = StrtofTrimmed(trimmed_00,iVar15);
      local_3a8 = (double)fVar24;
    }
    *processed_characters_count = (int)local_350 - iVar11;
    if (sign == false) goto LAB_003ed4eb;
    local_3a8._4_4_ = (uint)((ulong)local_3a8 >> 0x20);
    local_3a8._4_4_ = local_3a8._4_4_ ^ 0x80000000;
  }
LAB_003ed4e6:
LAB_003ed4eb:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return local_3a8;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;
  const bool allow_case_insensitivity = (flags_ & ALLOW_CASE_INSENSITIVITY) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != DOUBLE_CONVERSION_NULLPTR) {
    if (ConsumeFirstCharacter(*current, infinity_symbol_, allow_case_insensitivity)) {
      if (!ConsumeSubString(&current, end, infinity_symbol_, allow_case_insensitivity)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != DOUBLE_CONVERSION_NULLPTR) {
    if (ConsumeFirstCharacter(*current, nan_symbol_, allow_case_insensitivity)) {
      if (!ConsumeSubString(&current, end, nan_symbol_, allow_case_insensitivity)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    if (Advance(&current, separator_, 10, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if (((flags_ & ALLOW_HEX) || (flags_ & ALLOW_HEX_FLOATS)) &&
        (*current == 'x' || *current == 'X')) {
      ++current;

      if (current == end) return junk_string_value_;  // "0x"

      bool parse_as_hex_float = (flags_ & ALLOW_HEX_FLOATS) &&
                IsHexFloatString(current, end, separator_, allow_trailing_junk);

      if (!parse_as_hex_float && !isDigit(*current, 16)) {
        return junk_string_value_;
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           separator_,
                                           parse_as_hex_float,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      if (Advance(&current, separator_, 10, end)) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  DOUBLE_CONVERSION_STACK_UNINITIALIZED char
      buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    if (Advance(&current, separator_, 10, end)) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    if (Advance(&current, separator_, 10, end)) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        if (Advance(&current, separator_, 10, end)) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      if (Advance(&current, separator_, 10, end)) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    Iterator junk_begin = current;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        current = junk_begin;
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          current = junk_begin;
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        current = junk_begin;
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    DOUBLE_CONVERSION_ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  separator_,
                                  false, // Don't parse as hex_float.
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    DOUBLE_CONVERSION_ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  // Code above ensures there are no leading zeros and the buffer has fewer than
  // kMaxSignificantDecimalDigits characters. Trim trailing zeros.
  Vector<const char> chars(buffer, buffer_pos);
  chars = TrimTrailingZeros(chars);
  exponent += buffer_pos - chars.length();

  double converted;
  if (read_as_double) {
    converted = StrtodTrimmed(chars, exponent);
  } else {
    converted = StrtofTrimmed(chars, exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}